

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

uint32_t helper_neon_rbit_u8_arm(uint32_t x)

{
  uint uVar1;
  
  uVar1 = (x & 0xf0f0f0f) << 4 | x >> 4 & 0xf0f0f0f;
  return (uVar1 >> 1 & 0x22222222 | uVar1 >> 3 & 0x11111111) + (uVar1 & 0x22222222) * 2 +
         (uVar1 & 0xf1111111) * 8;
}

Assistant:

uint32_t HELPER(neon_rbit_u8)(uint32_t x)
{
    x =  ((x & 0xf0f0f0f0) >> 4)
       | ((x & 0x0f0f0f0f) << 4);
    x =  ((x & 0x88888888) >> 3)
       | ((x & 0x44444444) >> 1)
       | ((x & 0x22222222) << 1)
       | ((x & 0x11111111) << 3);
    return x;
}